

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_makers.hpp
# Opt level: O1

bool so_5::details::handlers_bunch_basics_t::find_and_use_handler
               (msg_type_and_handler_pair_t *left,msg_type_and_handler_pair_t *right,
               type_index *msg_type,message_ref_t *message,invocation_type_t invocation)

{
  char *__s1;
  anon_class_24_3_ebd80789 handler;
  int iVar1;
  msg_type_and_handler_pair_t *pmVar2;
  bool bVar3;
  msg_type_and_handler_pair_t *it;
  msg_type_and_handler_pair_t key;
  invocation_type_t local_84;
  msg_type_and_handler_pair_t *local_80;
  msg_type_and_handler_pair_t **local_78;
  message_ref_t *pmStack_70;
  undefined4 local_68;
  undefined4 uStack_64;
  type_info *local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  code *pcStack_48;
  undefined8 uStack_40;
  undefined4 local_38;
  
  local_60 = msg_type->_M_target;
  local_58 = 0;
  uStack_50 = 0;
  pcStack_48 = (code *)0x0;
  uStack_40 = 0;
  local_38 = 0;
  pmVar2 = std::
           __lower_bound<so_5::details::msg_type_and_handler_pair_t_const*,so_5::details::msg_type_and_handler_pair_t,__gnu_cxx::__ops::_Iter_less_val>
                     (left,right,&local_60);
  local_80 = pmVar2;
  if (pmVar2 != right) {
    __s1 = *(char **)((pmVar2->m_msg_type)._M_target + 8);
    if (__s1 == *(char **)(local_60 + 8)) {
LAB_0021df90:
      bVar3 = true;
      if (invocation == service_request) {
        local_78 = &local_80;
        local_68 = 1;
        handler._20_4_ = uStack_64;
        handler.invocation = 1;
        handler.message = message;
        handler.it = local_78;
        pmStack_70 = message;
        msg_service_request_base_t::
        dispatch_wrapper<so_5::details::handlers_bunch_basics_t::find_and_use_handler(so_5::details::msg_type_and_handler_pair_t_const*,so_5::details::msg_type_and_handler_pair_t_const*,std::type_index_const&,so_5::intrusive_ptr_t<so_5::message_t>&,so_5::invocation_type_t)::_lambda()_1_>
                  (message,handler);
      }
      else if (invocation == event) {
        local_84 = event;
        if ((pmVar2->m_handler).super__Function_base._M_manager == (_Manager_type)0x0) {
          std::__throw_bad_function_call();
        }
        (*(pmVar2->m_handler)._M_invoker)((_Any_data *)&pmVar2->m_handler,&local_84,message);
      }
      goto LAB_0021df68;
    }
    if (*__s1 != '*') {
      iVar1 = strcmp(__s1,*(char **)(local_60 + 8));
      if (iVar1 == 0) goto LAB_0021df90;
    }
  }
  bVar3 = false;
LAB_0021df68:
  if (pcStack_48 != (code *)0x0) {
    (*pcStack_48)(&local_58,&local_58,3);
  }
  return bVar3;
}

Assistant:

static inline bool
		find_and_use_handler(
			const msg_type_and_handler_pair_t * left,
			const msg_type_and_handler_pair_t * right,
			const std::type_index & msg_type,
			message_ref_t & message,
			invocation_type_t invocation )
			{
				bool ret_value = false;

				msg_type_and_handler_pair_t key{ msg_type };
				auto it = std::lower_bound( left, right, key );
				if( it != right && it->m_msg_type == key.m_msg_type )
					{
						// Handler is found and must be called.
						ret_value = true;
						if( invocation_type_t::event == invocation )
							// This is a async message.
							// Simple call is enough.
							it->m_handler( invocation, message );
						else if( invocation_type_t::service_request == invocation )
							// Invocation should be done in a special wrapper.
							msg_service_request_base_t::dispatch_wrapper(
									message,
									[&it, &message, invocation] {
										it->m_handler( invocation, message );
									} );
					}

				return ret_value;
			}